

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<std::complex<double>_>::TPZVec
          (TPZVec<std::complex<double>_> *this,int64_t size,complex<double> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  complex<double> *pcVar3;
  undefined8 *puVar4;
  undefined8 *in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  int64_t i;
  complex<double> *local_58;
  long local_30;
  
  *in_RDI = &PTR__TPZVec_023d8a58;
  in_RDI[1] = 0;
  if ((long)in_RSI < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<std::complex<double>>::TPZVec(const int64_t, const T &) [TVar = std::complex<double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    in_RDI[2] = 0;
    in_RDI[3] = 0;
  }
  else {
    if (in_RSI != 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
      if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      pcVar3 = (complex<double> *)operator_new__(uVar2);
      if (in_RSI != 0) {
        local_58 = pcVar3;
        do {
          std::complex<double>::complex(local_58,0.0,0.0);
          local_58 = local_58 + 1;
        } while (local_58 != pcVar3 + in_RSI);
      }
      in_RDI[1] = pcVar3;
    }
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
    for (local_30 = 0; local_30 < (long)in_RSI; local_30 = local_30 + 1) {
      puVar4 = (undefined8 *)(in_RDI[1] + local_30 * 0x10);
      *puVar4 = *in_RDX;
      puVar4[1] = in_RDX[1];
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}